

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lefreader.cpp
# Opt level: O0

bool __thiscall LEFReader::parseSymmetry(LEFReader *this)

{
  token_t tVar1;
  string local_30 [8];
  string symmetry;
  LEFReader *this_local;
  
  symmetry.field_2._8_8_ = this;
  std::__cxx11::string::string(local_30);
  tVar1 = tokenize(this,&this->m_tokstr);
  this->m_curtok = tVar1;
  while (this->m_curtok != TOK_SEMICOL) {
    std::__cxx11::string::operator+=(local_30,(string *)&this->m_tokstr);
    std::__cxx11::string::operator+=(local_30," ");
    tVar1 = tokenize(this,&this->m_tokstr);
    this->m_curtok = tVar1;
  }
  std::__cxx11::string::~string(local_30);
  return true;
}

Assistant:

bool LEFReader::parseSymmetry()
{
    // SYMMETRY (X|Y|R90)+ ';' 

    
    std::string symmetry;

    // read options until we get to the semicolon.
    m_curtok = tokenize(m_tokstr);
    while(m_curtok!= TOK_SEMICOL)
    {
        symmetry += m_tokstr;
        symmetry += " ";
        m_curtok = tokenize(m_tokstr);
    }

    //std::cout << "  SYMMETRY " << symmetry << "\n";

    return true;
}